

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::ImageLookup
          (PortalImageInfiniteLight *this,Point2f uv,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  RGBColorSpace *cs;
  undefined1 auVar2 [16];
  PortalImageInfiniteLight *pPVar3;
  RGB *pRVar4;
  int c;
  int c_00;
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar8 [56];
  undefined1 extraout_var [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined8 in_XMM1_Qb;
  RGB RVar9;
  SampledSpectrum SVar10;
  RGB local_98;
  undefined1 local_88 [16];
  PortalImageInfiniteLight *local_70;
  SampledWavelengths *local_68;
  WrapMode2D local_60;
  SampledSpectrum local_58;
  RGBIlluminantSpectrum spec;
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  local_88 = auVar5._0_16_;
  local_98.r = 0.0;
  local_98.g = 0.0;
  local_98.b = 0.0;
  local_70 = this;
  local_68 = lambda;
  for (c_00 = 0; pPVar3 = local_70, auVar8 = auVar5._8_56_, c_00 != 3; c_00 = c_00 + 1) {
    WrapMode2D::WrapMode2D(&local_60,Clamp);
    auVar5._0_4_ = Image::LookupNearestChannel(&this->image,(Point2f)local_88._0_8_,c_00,local_60);
    auVar5._4_60_ = extraout_var;
    pRVar4 = &local_98;
    if ((c_00 != 0) && (pRVar4 = (RGB *)&local_98.g, c_00 != 1)) {
      pRVar4 = (RGB *)&local_98.b;
    }
    pRVar4->r = auVar5._0_4_;
  }
  cs = local_70->imageColorSpace;
  RVar9 = ClampZero(&local_98);
  auVar6._0_8_ = RVar9._0_8_;
  auVar6._8_56_ = auVar8;
  uVar1 = vmovlps_avx(auVar6._0_16_);
  local_58.values.values[2] = RVar9.b;
  local_58.values.values[0] = (float)(int)uVar1;
  local_58.values.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  RGBIlluminantSpectrum::RGBIlluminantSpectrum(&spec,cs,(RGB *)&local_58);
  auVar8 = (undefined1  [56])0x0;
  local_88._0_4_ = pPVar3->scale;
  SVar10 = RGBIlluminantSpectrum::Sample(&spec,local_68);
  auVar7._0_8_ = SVar10.values.values._0_8_;
  auVar7._8_56_ = auVar8;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar10.values.values._8_8_;
  local_58.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar2);
  SVar10 = SampledSpectrum::operator*(&local_58,(Float)local_88._0_4_);
  return (array<float,_4>)(array<float,_4>)SVar10;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::ImageLookup(
    Point2f uv, const SampledWavelengths &lambda) const {
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(uv, c);
    RGBIlluminantSpectrum spec(*imageColorSpace, ClampZero(rgb));
    return scale * spec.Sample(lambda);
}